

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O2

bool __thiscall
cmGeneratorTarget::GetConfigCommonSourceFiles
          (cmGeneratorTarget *this,vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> *files)

{
  pointer ppcVar1;
  cmSourceFile *pcVar2;
  cmLocalGenerator *this_00;
  pointer pbVar3;
  pointer pbVar4;
  pointer ppcVar5;
  bool bVar6;
  ostream *poVar7;
  string *psVar8;
  pointer ppcVar9;
  pointer config;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  configs;
  vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> configFiles;
  string local_228;
  string thisConfigFiles;
  string firstConfigFiles;
  string local_1c8;
  ostringstream e;
  
  configs.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  configs.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  configs.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  cmMakefile::GetConfigurations(&local_1c8,this->Makefile,&configs,true);
  std::__cxx11::string::~string((string *)&local_1c8);
  if (configs.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      configs.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::emplace_back<>(&configs);
  }
  pbVar3 = configs.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  GetSourceFilesWithoutObjectLibraries
            (this,files,
             configs.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start);
  config = pbVar3;
  while( true ) {
    pbVar4 = configs.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (config == configs.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish) goto LAB_002beb08;
    configFiles.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    configFiles.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    configFiles.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    GetSourceFilesWithoutObjectLibraries
              (this,(vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> *)
                    &configFiles.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>
               ,config);
    bVar6 = std::operator!=((vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> *)
                            &configFiles.
                             super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>,
                            files);
    if (bVar6) break;
    std::_Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>::~_Vector_base
              (&configFiles.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>);
    config = config + 1;
  }
  firstConfigFiles._M_string_length = 0;
  firstConfigFiles.field_2._M_local_buf[0] = '\0';
  ppcVar1 = (files->super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>)._M_impl.
            super__Vector_impl_data._M_finish;
  firstConfigFiles._M_dataplus._M_p = (pointer)&firstConfigFiles.field_2;
  for (ppcVar9 = (files->super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>).
                 _M_impl.super__Vector_impl_data._M_start;
      ppcVar5 = configFiles.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>.
                _M_impl.super__Vector_impl_data._M_finish, ppcVar9 != ppcVar1; ppcVar9 = ppcVar9 + 1
      ) {
    pcVar2 = *ppcVar9;
    std::__cxx11::string::append((char *)&firstConfigFiles);
    cmSourceFile::GetFullPath(pcVar2,(string *)0x0);
    std::__cxx11::string::append((string *)&firstConfigFiles);
  }
  thisConfigFiles._M_dataplus._M_p = (pointer)&thisConfigFiles.field_2;
  thisConfigFiles._M_string_length = 0;
  thisConfigFiles.field_2._M_local_buf[0] = '\0';
  for (ppcVar9 = configFiles.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>.
                 _M_impl.super__Vector_impl_data._M_start; ppcVar9 != ppcVar5; ppcVar9 = ppcVar9 + 1
      ) {
    pcVar2 = *ppcVar9;
    std::__cxx11::string::append((char *)&thisConfigFiles);
    cmSourceFile::GetFullPath(pcVar2,(string *)0x0);
    std::__cxx11::string::append((string *)&thisConfigFiles);
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&e);
  poVar7 = std::operator<<((ostream *)&e,"Target \"");
  psVar8 = GetName_abi_cxx11_(this);
  poVar7 = std::operator<<(poVar7,(string *)psVar8);
  poVar7 = std::operator<<(poVar7,
                           "\" has source files which vary by configuration. This is not supported by the \""
                          );
  (*this->GlobalGenerator->_vptr_cmGlobalGenerator[3])(&local_228);
  poVar7 = std::operator<<(poVar7,(string *)&local_228);
  poVar7 = std::operator<<(poVar7,"\" generator.\nConfig \"");
  poVar7 = std::operator<<(poVar7,(string *)pbVar3);
  poVar7 = std::operator<<(poVar7,"\":\n  ");
  poVar7 = std::operator<<(poVar7,(string *)&firstConfigFiles);
  poVar7 = std::operator<<(poVar7,"\nConfig \"");
  poVar7 = std::operator<<(poVar7,(string *)config);
  poVar7 = std::operator<<(poVar7,"\":\n  ");
  poVar7 = std::operator<<(poVar7,(string *)&thisConfigFiles);
  std::operator<<(poVar7,"\n");
  std::__cxx11::string::~string((string *)&local_228);
  this_00 = this->LocalGenerator;
  std::__cxx11::stringbuf::str();
  cmLocalGenerator::IssueMessage(this_00,FATAL_ERROR,&local_228);
  std::__cxx11::string::~string((string *)&local_228);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&e);
  std::__cxx11::string::~string((string *)&thisConfigFiles);
  std::__cxx11::string::~string((string *)&firstConfigFiles);
  std::_Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>::~_Vector_base
            (&configFiles.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>);
LAB_002beb08:
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&configs);
  return config == pbVar4;
}

Assistant:

bool cmGeneratorTarget::GetConfigCommonSourceFiles(
  std::vector<cmSourceFile*>& files) const
{
  std::vector<std::string> configs;
  this->Makefile->GetConfigurations(configs);
  if (configs.empty()) {
    configs.emplace_back();
  }

  std::vector<std::string>::const_iterator it = configs.begin();
  const std::string& firstConfig = *it;
  this->GetSourceFilesWithoutObjectLibraries(files, firstConfig);

  for (; it != configs.end(); ++it) {
    std::vector<cmSourceFile*> configFiles;
    this->GetSourceFilesWithoutObjectLibraries(configFiles, *it);
    if (configFiles != files) {
      std::string firstConfigFiles;
      const char* sep = "";
      for (cmSourceFile* f : files) {
        firstConfigFiles += sep;
        firstConfigFiles += f->GetFullPath();
        sep = "\n  ";
      }

      std::string thisConfigFiles;
      sep = "";
      for (cmSourceFile* f : configFiles) {
        thisConfigFiles += sep;
        thisConfigFiles += f->GetFullPath();
        sep = "\n  ";
      }
      std::ostringstream e;
      /* clang-format off */
      e << "Target \"" << this->GetName()
        << "\" has source files which vary by "
        "configuration. This is not supported by the \""
        << this->GlobalGenerator->GetName()
        << "\" generator.\n"
          "Config \"" << firstConfig << "\":\n"
          "  " << firstConfigFiles << "\n"
          "Config \"" << *it << "\":\n"
          "  " << thisConfigFiles << "\n";
      /* clang-format on */
      this->LocalGenerator->IssueMessage(MessageType::FATAL_ERROR, e.str());
      return false;
    }
  }
  return true;
}